

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void cfd::core::AnalyzeBip32KeyData
               (void *extkey,string *base58,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *serialize_data,
               uint32_t *version,uint8_t *depth,uint32_t *child,ByteData256 *chaincode,
               Privkey *privkey,Pubkey *pubkey,uint32_t *fingerprint)

{
  uchar *bytes;
  char *pcVar1;
  value_type_conflict *__val;
  CfdException *pCVar2;
  pointer puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  int ret;
  string clsname;
  size_t written;
  ext_key output;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  int local_19c;
  Pubkey local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  ByteData local_120;
  ByteData256 local_108;
  ext_key local_f0;
  
  memset(&local_f0,0,0xc0);
  pcVar1 = "Constructor_ExtPrivkey";
  if (privkey == (Privkey *)0x0) {
    pcVar1 = "Constructor_ExtPubkey";
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,pcVar1 + 0xc,
             pcVar1 + 0xc + (10 - (ulong)(privkey == (Privkey *)0x0)));
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x52);
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x52;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x40] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x41] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x42] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x43] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x44] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x45] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x46] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x47] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x48] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x49] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4a] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4b] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4c] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4d] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4e] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4f] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x30] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x31] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x32] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x33] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x34] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x35] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x36] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x37] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x38] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x39] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3a] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3b] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2a] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2b] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2c] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2d] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2e] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2f] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x50] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x51] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x52;
  if (extkey == (void *)0x0) {
    if (base58 == (string *)0x0) {
      pvVar4 = serialize_data;
      if (serialize_data == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0)
      goto LAB_00428798;
    }
    else {
      local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_19c = wally_base58_to_bytes
                            ((base58->_M_dataplus)._M_p,1,
                             local_138.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,0x52,(size_t *)&local_158);
      if (local_19c != 0) {
        local_1c8._0_8_ = "cfdcore_hdwallet.cpp";
        local_1c8._8_4_ = 0x45;
        local_1b8._M_allocated_capacity = 0x5858ff;
        logger::log<std::__cxx11::string&,int&>
                  ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                   "{} wally_base58_to_bytes error. ret={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_19c);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_178," base58 decode error.");
        CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1c8);
        __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_138,
                 (size_type)
                 local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
      pvVar4 = &local_138;
      if (serialize_data != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (serialize_data,&local_138);
      }
    }
    bytes = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    local_19c = bip32_key_unserialize
                          (bytes,(long)(pvVar4->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)bytes,
                           &local_f0);
    if (local_19c != 0) {
      local_1c8._0_8_ = "cfdcore_hdwallet.cpp";
      local_1c8._8_4_ = 0x5a;
      local_1b8._M_allocated_capacity = 0x5858ff;
      logger::log<std::__cxx11::string&,int&>
                ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                 "{} bip32_key_unserialize error. ret={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                 &local_19c);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_178," unserialize error.");
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1c8);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    memcpy(&local_f0,extkey,0xc0);
  }
LAB_00428798:
  *version = local_f0.version;
  *depth = local_f0.depth;
  *child = local_f0.child_num;
  if (fingerprint != (uint32_t *)0x0) {
    *fingerprint = local_f0.parent160._0_4_;
  }
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x20;
  *(undefined8 *)
   (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x10) = local_f0.chain_code._16_8_;
  *(undefined8 *)
   (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x18) = local_f0.chain_code._24_8_;
  *(undefined8 *)
   local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = local_f0.chain_code._0_8_;
  *(undefined8 *)
   (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 8) = local_f0.chain_code._8_8_;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData256::ByteData256((ByteData256 *)local_1c8,&local_158);
  puVar3 = (chaincode->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (chaincode->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
  (chaincode->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
  (chaincode->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._M_allocated_capacity;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1b8._M_allocated_capacity = 0;
  if ((puVar3 != (pointer)0x0) &&
     (operator_delete(puVar3), (pointer)local_1c8._0_8_ != (pointer)0x0)) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if (privkey == (Privkey *)0x0) {
    if (pubkey == (Pubkey *)0x0) goto LAB_00428a3d;
    if (local_f0.priv_key[0] == '\0') {
      local_1c8._0_8_ = "cfdcore_hdwallet.cpp";
      local_1c8._8_4_ = 0x76;
      local_1b8._M_allocated_capacity = 0x5858ff;
      logger::log<std::__cxx11::string&>
                ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,"{} privkey enabled.",&local_178
                );
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_178," keytype error.");
      CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_1c8);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_1c8._0_8_ = operator_new(0x21);
    local_1c8._8_8_ = local_1c8._0_8_ + 0x21;
    *(uchar *)(local_1c8._0_8_ + 0x20) = local_f0.pub_key[0x20];
    *(undefined8 *)(local_1c8._0_8_ + 0x10) = local_f0.pub_key._16_8_;
    *(undefined8 *)(local_1c8._0_8_ + 0x18) = local_f0.pub_key._24_8_;
    *(undefined8 *)local_1c8._0_8_ = local_f0.pub_key._0_8_;
    *(undefined8 *)(local_1c8._0_8_ + 8) = local_f0.pub_key._8_8_;
    local_1b8._M_allocated_capacity = local_1c8._8_8_;
    ByteData::ByteData(&local_120,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8
                      );
    Pubkey::Pubkey(&local_198,&local_120);
    puVar3 = (pubkey->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pubkey->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pubkey->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pubkey->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((puVar3 != (pointer)0x0) &&
       (operator_delete(puVar3),
       local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_198.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    puVar3 = (pointer)local_1c8._0_8_;
    if (local_120.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      puVar3 = (pointer)local_1c8._0_8_;
    }
  }
  else {
    if (local_f0.priv_key[0] != '\0') {
      local_1c8._0_8_ = "cfdcore_hdwallet.cpp";
      local_1c8._8_4_ = 0x6c;
      local_1b8._M_allocated_capacity = 0x5858ff;
      logger::log<std::__cxx11::string&>
                ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,"{} privkey disabled.",
                 &local_178);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_178," keytype error.");
      CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_1c8);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start + 0x20;
    *(undefined8 *)
     (local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start + 0x10) = local_f0.priv_key._17_8_;
    *(undefined8 *)
     (local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start + 0x18) = local_f0.priv_key._25_8_;
    *(undefined8 *)
     local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
     .super__Vector_impl_data._M_start = local_f0.priv_key._1_8_;
    *(undefined8 *)
     (local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start + 8) = local_f0.priv_key._9_8_;
    local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    ByteData256::ByteData256
              (&local_108,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_198);
    Privkey::Privkey((Privkey *)local_1c8,&local_108,kMainnet,true);
    puVar3 = (privkey->data_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (privkey->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
    (privkey->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
    (privkey->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._M_allocated_capacity;
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1b8._M_allocated_capacity = 0;
    if (puVar3 == (pointer)0x0) {
      privkey->is_compressed_ = (bool)local_1b8._8_1_;
      *(undefined3 *)&privkey->field_0x19 = local_1b8._9_3_;
      privkey->net_type_ = local_1b8._12_4_;
    }
    else {
      operator_delete(puVar3);
      privkey->is_compressed_ = (bool)local_1b8._8_1_;
      *(undefined3 *)&privkey->field_0x19 = local_1b8._9_3_;
      privkey->net_type_ = local_1b8._12_4_;
      if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1c8._0_8_);
      }
    }
    puVar3 = local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      puVar3 = local_198.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
LAB_00428a3d:
  if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void AnalyzeBip32KeyData(
    const void* extkey, const std::string* base58,
    std::vector<uint8_t>* serialize_data, uint32_t* version, uint8_t* depth,
    uint32_t* child, ByteData256* chaincode, Privkey* privkey, Pubkey* pubkey,
    uint32_t* fingerprint) {
  struct ext_key output = {};
  std::string clsname = (privkey != nullptr) ? "ExtPrivkey" : "ExtPubkey";
  const std::vector<uint8_t>* serialize_bytes = nullptr;
  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN);
  int ret;

  if (extkey != nullptr) {
    memcpy(&output, extkey, sizeof(output));
  } else if (base58 != nullptr) {
    size_t written = 0;
    ret = wally_base58_to_bytes(
        base58->c_str(), BASE58_FLAG_CHECKSUM, data.data(), data.size(),
        &written);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "{} wally_base58_to_bytes error. ret={}", clsname,
          ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          clsname + " base58 decode error.");
    }
    data.resize(written);
    serialize_bytes = &data;
    if (serialize_data != nullptr) {
      *serialize_data = data;
    }
  } else {
    serialize_bytes = serialize_data;
  }

  if (serialize_bytes != nullptr) {
    // unserialize
    ret = bip32_key_unserialize(
        serialize_bytes->data(), serialize_bytes->size(), &output);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "{} bip32_key_unserialize error. ret={}", clsname,
          ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, clsname + " unserialize error.");
    }
  }

  *version = output.version;
  *depth = output.depth;
  *child = output.child_num;
  if (fingerprint) {
    memcpy(fingerprint, output.parent160, sizeof(*fingerprint));
  }
  std::vector<uint8_t> chaincode_bytes(kByteData256Length);
  memcpy(chaincode_bytes.data(), output.chain_code, chaincode_bytes.size());
  *chaincode = ByteData256(chaincode_bytes);
  if (privkey != nullptr) {
    if (output.priv_key[0] != BIP32_FLAG_KEY_PRIVATE) {
      warn(CFD_LOG_SOURCE, "{} privkey disabled.", clsname);
      throw CfdException(
          CfdError::kCfdIllegalStateError, clsname + " keytype error.");
    }
    // privkey
    std::vector<uint8_t> privkey_bytes(kByteData256Length);
    memcpy(privkey_bytes.data(), &output.priv_key[1], privkey_bytes.size());
    *privkey = Privkey(ByteData256(privkey_bytes));
  } else if (pubkey != nullptr) {
    if (output.priv_key[0] == BIP32_FLAG_KEY_PRIVATE) {
      warn(CFD_LOG_SOURCE, "{} privkey enabled.", clsname);
      throw CfdException(
          CfdError::kCfdIllegalStateError, clsname + " keytype error.");
    }
    std::vector<uint8_t> pubkey_bytes(Pubkey::kCompressedPubkeySize);
    memcpy(pubkey_bytes.data(), output.pub_key, pubkey_bytes.size());
    *pubkey = Pubkey(pubkey_bytes);
  }
}